

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * __thiscall
perfetto::base::IntToHexString_abi_cxx11_(string *__return_storage_ptr__,base *this,uint32_t number)

{
  char *dst;
  size_t final_len;
  size_t max_size;
  uint32_t number_local;
  string *buf;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  dst = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  SprintfTrunc(dst,0xb,"0x%02x",(ulong)this & 0xffffffff);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string IntToHexString(uint32_t number) {
  size_t max_size = 11;  // Max uint32 is 0xFFFFFFFF + 1 for null byte.
  std::string buf;
  buf.resize(max_size);
  size_t final_len = SprintfTrunc(&buf[0], max_size, "0x%02x", number);
  buf.resize(static_cast<size_t>(final_len));  // Cuts off the final null byte.
  return buf;
}